

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise3D::forward
          (DeconvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  int *piVar14;
  float *pfVar15;
  size_t sVar16;
  size_t sVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Mat *pMVar22;
  undefined4 in_EAX;
  int k;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  void *pvVar34;
  void *pvVar35;
  ulong uVar36;
  int iVar37;
  void *pvVar38;
  void *pvVar39;
  int i;
  int iVar40;
  ulong uVar41;
  void *pvVar42;
  long lVar43;
  int j;
  ulong uVar44;
  size_type __n;
  int k_1;
  void *pvVar45;
  ulong uVar46;
  int i_1;
  ulong uVar47;
  bool bVar48;
  undefined4 uVar49;
  float fVar50;
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  void *local_1e8;
  void *local_1d8;
  long local_1c8;
  allocator_type local_1b1;
  void *local_1b0;
  void *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  Mat *local_180;
  size_t local_178;
  ulong local_170;
  Mat local_168;
  undefined1 local_118 [16];
  ulong local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  size_t local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  void *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  Option *local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar25 = bottom_blob->w;
  iVar30 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  iVar3 = this->kernel_w;
  iVar4 = this->dilation_w;
  sVar13 = bottom_blob->elemsize;
  iVar5 = this->stride_w;
  iVar6 = this->kernel_h;
  iVar7 = this->dilation_h;
  iVar8 = this->stride_h;
  iVar9 = this->kernel_d;
  iVar10 = this->dilation_d;
  iVar28 = this->stride_d;
  iVar11 = this->output_pad_right;
  iVar37 = this->output_pad_bottom;
  iVar33 = this->output_pad_behind;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  auVar51._0_4_ = -(uint)(0 < this->pad_left);
  auVar51._4_4_ = -(uint)(0 < this->pad_right);
  auVar51._8_4_ = -(uint)(0 < this->pad_top);
  auVar51._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar23 = movmskps(in_EAX,auVar51);
  local_1c8 = 0x10;
  if (((((iVar23 == 0) && (this->pad_front < 1)) && (this->pad_behind < 1)) &&
      (((this->output_w < 1 || (this->output_h < 1)) || (this->output_d < 1)))) &&
     (local_1c8 = 8, &local_168 != top_blob)) {
    piVar14 = top_blob->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    local_168.data = top_blob->data;
    local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_168.elemsize = top_blob->elemsize;
    local_168.elempack = top_blob->elempack;
    local_168.allocator = top_blob->allocator;
    uVar18 = top_blob->dims;
    uVar19 = top_blob->w;
    uVar20 = top_blob->h;
    uVar21 = top_blob->d;
    local_168.c = top_blob->c;
    local_168.cstep = top_blob->cstep;
    local_168.dims = uVar18;
    local_168.w = uVar19;
    local_168.h = uVar20;
    local_168.d = uVar21;
  }
  local_98 = opt;
  Mat::create(&local_168,iVar11 + (iVar3 + -1) * iVar4 + (iVar25 + -1) * iVar5 + 1,
              iVar37 + 1 + (iVar6 + -1) * iVar7 + (iVar30 + -1) * iVar8,
              iVar33 + 1 + (iVar9 + -1) * iVar10 + (iVar2 + -1) * iVar28,this->num_output,sVar13,
              *(Allocator **)(&opt->lightmode + local_1c8));
  iVar30 = local_168.h;
  iVar25 = -100;
  if ((local_168.data != (void *)0x0) &&
     (local_1b0 = (void *)(long)local_168.c, local_168.cstep * (long)local_1b0 != 0)) {
    iVar25 = this->kernel_w;
    iVar2 = this->kernel_h;
    iVar3 = this->kernel_d;
    local_1a0 = (long)this->stride_w;
    local_88 = (long)this->stride_h;
    local_90 = (long)this->stride_d;
    iVar4 = this->dilation_w;
    iVar5 = this->dilation_h;
    iVar6 = this->dilation_d;
    local_100 = (ulong)(uint)this->group;
    local_78 = (ulong)(uint)this->activation_type;
    iVar7 = bottom_blob->c;
    local_198._0_4_ = local_168.w;
    uVar24 = iVar2 * iVar25 * iVar3;
    __n = (size_type)(int)uVar24;
    local_180 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_1b1);
    iVar10 = local_168.d;
    iVar9 = local_168.dims;
    iVar28 = 0;
    iVar8 = iVar25;
    if (iVar25 < 1) {
      iVar8 = iVar28;
    }
    iVar11 = iVar2;
    if (iVar2 < 1) {
      iVar11 = iVar28;
    }
    if (iVar3 < 1) {
      iVar3 = iVar28;
    }
    iVar33 = 0;
    iVar37 = 0;
    for (; iVar28 != iVar3; iVar28 = iVar28 + 1) {
      iVar23 = iVar37;
      for (iVar40 = 0; iVar23 = iVar8 + iVar23, iVar40 != iVar11; iVar40 = iVar40 + 1) {
        for (lVar43 = (long)iVar37; iVar23 != lVar43; lVar43 = lVar43 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar43] = iVar33;
          iVar33 = iVar33 + iVar4;
        }
        iVar33 = iVar33 + (local_198._0_4_ * iVar5 - iVar4 * iVar25);
        iVar37 = iVar37 + iVar8;
      }
      iVar33 = iVar33 + (iVar30 * iVar6 - iVar5 * iVar2) * local_198._0_4_;
    }
    iVar25 = (int)local_100;
    iVar30 = (int)local_1b0;
    if (iVar30 == iVar25 && iVar7 == iVar25) {
      local_c8 = bottom_blob->elemsize * bottom_blob->cstep;
      local_f8 = (this->bias_data).data;
      local_170 = local_168.cstep * local_168.elemsize;
      local_d0 = (long)local_168.h * (long)local_168.w;
      local_d8 = local_168.elemsize * local_d0 + 0xf & 0xfffffffffffffff0;
      uVar29 = local_168.h * local_168.w * local_168.d;
      pvVar45 = (void *)0x0;
      uVar36 = 0;
      if (0 < (int)uVar24) {
        uVar36 = (ulong)uVar24;
      }
      uVar24 = bottom_blob->w;
      uVar47 = 0;
      if (0 < (int)uVar24) {
        uVar47 = (ulong)uVar24;
      }
      uVar12 = bottom_blob->h;
      local_c0 = CONCAT44(local_c0._4_4_,uVar12);
      uVar26 = 0;
      if (0 < (int)uVar12) {
        uVar26 = (ulong)uVar12;
      }
      local_b0 = (void *)(ulong)(uint)bottom_blob->d;
      if (bottom_blob->d < 1) {
        local_b0 = pvVar45;
      }
      pvVar38 = (void *)(ulong)uVar29;
      if ((int)uVar29 < 1) {
        pvVar38 = pvVar45;
      }
      local_1b0 = (void *)((ulong)local_1b0 & 0xffffffff);
      if (iVar30 < 1) {
        local_1b0 = pvVar45;
      }
      local_b8 = (void *)(local_168.elemsize * local_d0 * local_90);
      local_178 = local_168.elemsize;
      local_198._0_8_ = (long)local_168.w * local_168.elemsize * local_88;
      local_e0 = CONCAT71(local_e0._1_7_,
                          (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                          local_f8 == (void *)0x0);
      local_e8 = bottom_blob->data;
      pvVar45 = (this->weight_data).data;
      local_f0 = local_168.data;
      pvVar39 = local_168.data;
      for (pvVar42 = (void *)0x0; pvVar42 != local_1b0; pvVar42 = (void *)((long)pvVar42 + 1)) {
        iVar25 = (int)(local_d8 / local_178);
        if (iVar9 == 4) {
          iVar25 = (int)local_d0;
        }
        uVar49 = 0;
        if ((char)local_e0 == '\0') {
          uVar49 = *(undefined4 *)((long)local_f8 + (long)pvVar42 * 4);
        }
        pvVar34 = (void *)(local_170 * (long)pvVar42 + (long)local_f0);
        local_118._0_8_ = pvVar34;
        iVar25 = iVar25 * iVar10;
        if (iVar25 < 1) {
          iVar25 = 0;
        }
        for (lVar43 = 0; iVar25 != (int)lVar43; lVar43 = lVar43 + 1) {
          *(undefined4 *)((long)pvVar39 + lVar43 * 4) = uVar49;
        }
        for (pvVar35 = (void *)0x0; pvVar35 != local_b0; pvVar35 = (void *)((long)pvVar35 + 1)) {
          for (uVar41 = 0; uVar41 != uVar26; uVar41 = uVar41 + 1) {
            for (uVar44 = 0; uVar44 != uVar47; uVar44 = uVar44 + 1) {
              lVar43 = uVar44 * local_1a0 * 4 +
                       local_198._0_8_ * uVar41 + (long)local_b8 * (long)pvVar35;
              fVar50 = *(float *)((long)local_e8 +
                                 (long)(int)(((int)local_c0 * (int)pvVar35 + (int)uVar41) * uVar24 +
                                            (int)uVar44) * 4 + local_c8 * (long)pvVar42);
              for (uVar27 = 0; uVar36 != uVar27; uVar27 = uVar27 + 1) {
                *(float *)((long)pvVar34 +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar27] * 4 + lVar43) =
                     *(float *)((long)pvVar45 + uVar27 * 4) * fVar50 +
                     *(float *)((long)pvVar34 +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 + lVar43);
              }
            }
          }
        }
        pfVar15 = (float *)(this->activation_params).data;
        local_1a8 = pvVar42;
        for (pvVar34 = (void *)0x0; pvVar38 != pvVar34; pvVar34 = (void *)((long)pvVar34 + 1)) {
          fVar50 = *(float *)((long)pvVar39 + (long)pvVar34 * 4);
          fVar53 = fVar50;
          switch((int)local_78) {
          case 1:
            if (fVar50 <= 0.0) {
              fVar53 = 0.0;
            }
            break;
          case 2:
            fVar53 = (float)(~-(uint)(0.0 < fVar50) & (uint)*pfVar15 |
                            -(uint)(0.0 < fVar50) & 0x3f800000) * fVar50;
            break;
          case 3:
            if (fVar50 <= *pfVar15) {
              fVar50 = *pfVar15;
            }
            fVar53 = pfVar15[1];
            if (fVar50 <= pfVar15[1]) {
              fVar53 = fVar50;
            }
            break;
          case 4:
            if (88.37626 <= fVar50) {
              fVar50 = 88.37626;
            }
            fVar50 = expf((float)(-(uint)(fVar50 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar50 < -88.37626) & (uint)-fVar50));
            pvVar42 = local_1a8;
            fVar53 = 1.0 / (fVar50 + 1.0);
            break;
          case 5:
            local_118 = ZEXT416((uint)fVar50);
            fVar50 = expf(fVar50);
            fVar50 = logf(fVar50 + 1.0);
            fVar50 = tanhf(fVar50);
            pvVar42 = local_1a8;
            fVar53 = fVar50 * (float)local_118._0_4_;
            break;
          case 6:
            fVar1 = *pfVar15;
            fVar52 = -pfVar15[1] / fVar1;
            fVar53 = 0.0;
            if ((fVar52 <= fVar50) && (fVar53 = fVar50, fVar50 <= fVar52 + 1.0 / fVar1)) {
              fVar53 = (fVar1 * fVar50 + pfVar15[1]) * fVar50;
            }
          }
          *(float *)((long)pvVar39 + (long)pvVar34 * 4) = fVar53;
        }
        pvVar39 = (void *)((long)pvVar39 + local_170);
        pvVar45 = (void *)((long)pvVar45 + __n * 4);
      }
    }
    else {
      uVar36 = (long)iVar7 / (long)iVar25;
      uVar47 = (long)((ulong)(uint)(iVar30 >> 0x1f) << 0x20 | (ulong)local_1b0 & 0xffffffff) /
               (long)iVar25;
      iVar30 = (int)uVar36;
      uVar26 = 0;
      if (0 < (int)uVar24) {
        uVar26 = (ulong)uVar24;
      }
      uVar41 = 0;
      if (0 < iVar30) {
        uVar41 = uVar36 & 0xffffffff;
      }
      local_a4 = (int)uVar47;
      local_d0 = 0;
      if (0 < local_a4) {
        local_d0 = uVar47 & 0xffffffff;
      }
      local_68 = (long)iVar30;
      local_70 = (long)local_a4;
      local_100 = local_100 & 0xffffffff;
      if (iVar25 < 1) {
        local_100 = 0;
      }
      local_a4 = local_a4 * iVar30 * uVar24;
      local_50 = (long)(int)(iVar30 * uVar24) << 2;
      iVar25 = 0;
      local_80 = 0;
      uVar36 = 0;
      while (iVar30 = local_168.d, uVar36 != local_100) {
        local_d8 = uVar36 * local_70;
        local_178 = local_168.cstep * local_168.elemsize;
        local_e8 = (void *)((long)local_168.h * (long)local_168.w);
        local_f0 = (void *)(local_168.elemsize * (long)local_e8 + 0xf & 0xfffffffffffffff0);
        local_58 = (this->bias_data).data;
        bVar48 = local_58 != (void *)0x0;
        iVar2 = (this->bias_data).c;
        sVar13 = (this->bias_data).cstep;
        lVar43 = uVar36 * local_68;
        uVar24 = local_168.h * local_168.w * local_168.d;
        uVar47 = (ulong)(uint)bottom_blob->w;
        if (bottom_blob->w < 1) {
          uVar47 = 0;
        }
        uVar29 = bottom_blob->h;
        if (bottom_blob->h < 1) {
          uVar29 = 0;
        }
        local_1a8 = (void *)(ulong)uVar29;
        local_1b0 = (void *)(ulong)(uint)bottom_blob->d;
        if (bottom_blob->d < 1) {
          local_1b0 = (void *)0x0;
        }
        if ((int)uVar24 < 1) {
          uVar24 = 0;
        }
        local_170 = (ulong)uVar24;
        local_c8 = local_168.elemsize * (long)local_e8 * local_90;
        local_e0 = local_168.elemsize;
        local_c0 = (long)local_168.w * local_168.elemsize * local_88;
        local_f8 = local_168.data;
        local_1d8 = (void *)(local_178 * local_80 + (long)local_168.data);
        local_1e8 = (void *)((long)iVar25 * 4 + (long)(this->weight_data).data);
        local_9c = local_168.dims;
        local_a0 = iVar25;
        local_60 = uVar36;
        for (uVar44 = 0; uVar44 != local_d0; uVar44 = uVar44 + 1) {
          iVar25 = (int)((ulong)local_f0 / local_e0);
          if (local_9c == 4) {
            iVar25 = (int)local_e8;
          }
          uVar49 = 0;
          if ((long)iVar2 * sVar13 != 0 && bVar48) {
            uVar49 = *(undefined4 *)((long)local_58 + (uVar44 + local_d8) * 4);
          }
          local_b8 = (void *)((uVar44 + local_d8) * local_178 + (long)local_f8);
          iVar25 = iVar25 * iVar30;
          if (iVar25 < 1) {
            iVar25 = 0;
          }
          for (lVar31 = 0; iVar25 != (int)lVar31; lVar31 = lVar31 + 1) {
            *(undefined4 *)((long)local_1d8 + lVar31 * 4) = uVar49;
          }
          local_118._0_8_ = uVar44;
          for (pvVar45 = (void *)0x0; pvVar45 != local_1b0; pvVar45 = (void *)((long)pvVar45 + 1)) {
            local_b0 = (void *)(local_c8 * (long)pvVar45 + (long)local_b8);
            local_198._0_8_ = pvVar45;
            for (pvVar38 = (void *)0x0; pvVar38 != local_1a8; pvVar38 = (void *)((long)pvVar38 + 1))
            {
              for (uVar36 = 0; uVar36 != uVar47; uVar36 = uVar36 + 1) {
                lVar31 = uVar36 * local_1a0 * 4 + local_c0 * (long)pvVar38;
                iVar25 = bottom_blob->h;
                sVar16 = bottom_blob->elemsize;
                sVar17 = bottom_blob->cstep;
                lVar32 = (long)bottom_blob->w * sVar16;
                pvVar39 = bottom_blob->data;
                pvVar42 = local_1e8;
                for (uVar27 = 0; uVar27 != uVar41; uVar27 = uVar27 + 1) {
                  fVar50 = *(float *)((long)pvVar39 +
                                     (uVar27 + lVar43) * sVar17 * sVar16 +
                                     uVar36 * 4 +
                                     lVar32 * (long)pvVar38 + (long)iVar25 * (long)pvVar45 * lVar32)
                  ;
                  for (uVar46 = 0; uVar26 != uVar46; uVar46 = uVar46 + 1) {
                    *(float *)((long)local_b0 +
                              (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[uVar46] * 4 + lVar31) =
                         *(float *)((long)pvVar42 + uVar46 * 4) * fVar50 +
                         *(float *)((long)local_b0 +
                                   (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar46] * 4 +
                                   lVar31);
                  }
                  pvVar42 = (void *)((long)pvVar42 + __n * 4);
                }
              }
            }
          }
          pfVar15 = (float *)(this->activation_params).data;
          for (uVar36 = 0; local_170 != uVar36; uVar36 = uVar36 + 1) {
            fVar50 = *(float *)((long)local_1d8 + uVar36 * 4);
            fVar53 = fVar50;
            switch((int)local_78) {
            case 1:
              if (fVar50 <= 0.0) {
                fVar53 = 0.0;
              }
              break;
            case 2:
              fVar53 = (float)(~-(uint)(0.0 < fVar50) & (uint)*pfVar15 |
                              -(uint)(0.0 < fVar50) & 0x3f800000) * fVar50;
              break;
            case 3:
              if (fVar50 <= *pfVar15) {
                fVar50 = *pfVar15;
              }
              fVar53 = pfVar15[1];
              if (fVar50 <= pfVar15[1]) {
                fVar53 = fVar50;
              }
              break;
            case 4:
              if (88.37626 <= fVar50) {
                fVar50 = 88.37626;
              }
              fVar50 = expf((float)(-(uint)(fVar50 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar50 < -88.37626) & (uint)-fVar50));
              uVar44 = local_118._0_8_;
              fVar53 = 1.0 / (fVar50 + 1.0);
              break;
            case 5:
              local_198 = ZEXT416((uint)fVar50);
              fVar50 = expf(fVar50);
              fVar50 = logf(fVar50 + 1.0);
              fVar50 = tanhf(fVar50);
              uVar44 = local_118._0_8_;
              fVar53 = fVar50 * (float)local_198._0_4_;
              break;
            case 6:
              fVar1 = *pfVar15;
              fVar52 = -pfVar15[1] / fVar1;
              fVar53 = 0.0;
              if ((fVar52 <= fVar50) && (fVar53 = fVar50, fVar50 <= fVar52 + 1.0 / fVar1)) {
                fVar53 = (fVar1 * fVar50 + pfVar15[1]) * fVar50;
              }
            }
            *(float *)((long)local_1d8 + uVar36 * 4) = fVar53;
          }
          local_1d8 = (void *)((long)local_1d8 + local_178);
          local_1e8 = (void *)((long)local_1e8 + local_50);
        }
        local_80 = local_80 + local_70;
        iVar25 = local_a0 + local_a4;
        uVar36 = local_60 + 1;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    pMVar22 = local_180;
    cut_padding(this,&local_168,local_180,local_98);
    if ((pMVar22->data == (void *)0x0) || (iVar25 = 0, (long)pMVar22->c * pMVar22->cstep == 0)) {
      iVar25 = -100;
    }
  }
  piVar14 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int DeconvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}